

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::CleanStringLineEndings(string *str,bool auto_end_last_line)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  uint64 v_00;
  char *pcVar4;
  undefined1 *puVar5;
  byte in_SIL;
  ulong in_RDI;
  const_reference in;
  uint64_t v;
  ptrdiff_t input_pos;
  char *p;
  ptrdiff_t len;
  bool r_seen;
  ptrdiff_t output_pos;
  long local_38;
  long local_18;
  
  local_18 = 0;
  bVar1 = false;
  lVar2 = std::__cxx11::string::size();
  lVar3 = std::__cxx11::string::operator[](in_RDI);
  local_38 = 0;
  while (local_38 < lVar2) {
    if (((bVar1) || (lVar2 <= local_38 + 8)) ||
       (v_00 = GOOGLE_UNALIGNED_LOAD64((void *)(lVar3 + local_38)),
       (v_00 + 0xf1f1f1f1f1f1f1f2 & (v_00 ^ 0xffffffffffffffff) & 0x8080808080808080) != 0)) {
      pcVar4 = (char *)(lVar3 + local_38);
      if (*pcVar4 == '\r') {
        if (bVar1) {
          *(undefined1 *)(lVar3 + local_18) = 10;
          local_18 = local_18 + 1;
        }
        bVar1 = true;
      }
      else {
        if (*pcVar4 == '\n') {
          if (local_38 != local_18) {
            *(undefined1 *)(lVar3 + local_18) = 10;
          }
        }
        else {
          if (bVar1) {
            *(undefined1 *)(lVar3 + local_18) = 10;
            local_18 = local_18 + 1;
          }
          if (local_38 != local_18) {
            *(char *)(lVar3 + local_18) = *pcVar4;
          }
        }
        local_18 = local_18 + 1;
        bVar1 = false;
      }
      local_38 = local_38 + 1;
    }
    else {
      if (local_18 != local_38) {
        GOOGLE_UNALIGNED_STORE64((void *)(lVar3 + local_18),v_00);
      }
      local_38 = local_38 + 8;
      local_18 = local_18 + 8;
    }
  }
  if ((bVar1) ||
     ((((in_SIL & 1) != 0 && (0 < local_18)) && (*(char *)(lVar3 + local_18 + -1) != '\n')))) {
    std::__cxx11::string::resize(in_RDI);
    puVar5 = (undefined1 *)std::__cxx11::string::operator[](in_RDI);
    *puVar5 = 10;
  }
  else if (local_18 < lVar2) {
    std::__cxx11::string::resize(in_RDI);
  }
  return;
}

Assistant:

void CleanStringLineEndings(std::string *str, bool auto_end_last_line) {
  ptrdiff_t output_pos = 0;
  bool r_seen = false;
  ptrdiff_t len = str->size();

  char *p = &(*str)[0];

  for (ptrdiff_t input_pos = 0; input_pos < len;) {
    if (!r_seen && input_pos + 8 < len) {
      uint64_t v = GOOGLE_UNALIGNED_LOAD64(p + input_pos);
      // Loop over groups of 8 bytes at a time until we come across
      // a word that has a byte whose value is less than or equal to
      // '\r' (i.e. could contain a \n (0x0a) or a \r (0x0d) ).
      //
      // We use a has_less macro that quickly tests a whole 64-bit
      // word to see if any of the bytes has a value < N.
      //
      // For more details, see:
      //   http://graphics.stanford.edu/~seander/bithacks.html#HasLessInWord
#define has_less(x, n) (((x) - ~0ULL / 255 * (n)) & ~(x) & ~0ULL / 255 * 128)
      if (!has_less(v, '\r' + 1)) {
#undef has_less
        // No byte in this word has a value that could be a \r or a \n
        if (output_pos != input_pos) {
          GOOGLE_UNALIGNED_STORE64(p + output_pos, v);
        }
        input_pos += 8;
        output_pos += 8;
        continue;
      }
    }
    std::string::const_reference in = p[input_pos];
    if (in == '\r') {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = true;
    } else if (in == '\n') {
      if (input_pos != output_pos)
        p[output_pos++] = '\n';
      else
        output_pos++;
      r_seen = false;
    } else {
      if (r_seen) p[output_pos++] = '\n';
      r_seen = false;
      if (input_pos != output_pos)
        p[output_pos++] = in;
      else
        output_pos++;
    }
    input_pos++;
  }
  if (r_seen ||
      (auto_end_last_line && output_pos > 0 && p[output_pos - 1] != '\n')) {
    str->resize(output_pos + 1);
    str->operator[](output_pos) = '\n';
  } else if (output_pos < len) {
    str->resize(output_pos);
  }
}